

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::Encode
          (UnderwaterAcousticEmitterSystem *this,KDataStream *stream)

{
  pointer pUVar1;
  pointer pUVar2;
  
  KDataStream::Write(stream,this->m_ui8EmitterSystemDataLength);
  KDataStream::Write(stream,this->m_ui8NumBeams);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  (*(this->m_AES).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_AES,stream);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Location,stream);
  pUVar1 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pUVar2 = (this->m_vUAEB).
                super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
                ._M_impl.super__Vector_impl_data._M_start; pUVar2 != pUVar1; pUVar2 = pUVar2 + 1) {
    (*(pUVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pUVar2,stream);
  }
  return;
}

Assistant:

void UnderwaterAcousticEmitterSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui8EmitterSystemDataLength
           << m_ui8NumBeams
           << m_ui16Padding1
           << KDIS_STREAM m_AES
           << KDIS_STREAM m_Location;

    vector<UnderwaterAcousticEmitterBeam>::const_iterator citr = m_vUAEB.begin();
    vector<UnderwaterAcousticEmitterBeam>::const_iterator citrEnd = m_vUAEB.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << KDIS_STREAM *citr;
    }
}